

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkResult tonk_inject(TonkSocket tonkSocket,uint16_t sourcePort,void *data,uint32_t bytes)

{
  uint32_t in_ECX;
  void *in_RDX;
  uint16_t in_SI;
  TonkSocket in_RDI;
  TonkResult local_4;
  
  if (fp_tonk_inject == (fp_tonk_inject_t)0x0) {
    local_4 = Tonk_DLL_Not_Found;
  }
  else {
    local_4 = (*fp_tonk_inject)(in_RDI,in_SI,in_RDX,in_ECX);
  }
  return local_4;
}

Assistant:

TonkResult tonk_inject(
    TonkSocket   tonkSocket, ///< [in] Socket to inject
    uint16_t     sourcePort, ///< [in] Source port of datagram
    const void*        data, ///< [in] Datagram data
    uint32_t          bytes  ///< [in] Datagram bytes
)
{
    if (!fp_tonk_inject) {
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_inject(
        tonkSocket,
        sourcePort,
        data,
        bytes);
}